

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  AlphaNum *a;
  AlphaNum *a_00;
  protobuf *this_00;
  AlphaNum *this_01;
  uint64_t max_value;
  uint64_t uVar2;
  AlphaNum AStack_98;
  uint64_t value_1;
  string local_60;
  double value;
  LocationRecorder location;
  
  this_01 = &AStack_98;
  if (((field->_has_bits_).has_bits_[0] & 8) != 0) {
    std::__cxx11::string::string
              ((string *)&AStack_98,"Already set option \"default\".",(allocator *)&local_60);
    AddError(this,(string *)&AStack_98);
    std::__cxx11::string::~string((string *)&AStack_98);
    FieldDescriptorProto::clear_default_value(field);
  }
  bVar1 = Consume(this,"default");
  if ((!bVar1) || (bVar1 = Consume(this,"="), !bVar1)) {
    return false;
  }
  LocationRecorder::LocationRecorder(&location,field_location,7);
  LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,DEFAULT_VALUE);
  output = FieldDescriptorProto::_internal_mutable_default_value_abi_cxx11_(field);
  if (((field->_has_bits_).has_bits_[0] & 0x400) == 0) {
    std::__cxx11::string::_M_assign((string *)output);
    bVar1 = true;
    io::Tokenizer::Next(this->input_);
    goto LAB_00351e4c;
  }
  switch(field->type_) {
  case 1:
  case 2:
    bVar1 = TryConsume(this,"-");
    if (bVar1) {
      std::__cxx11::string::append((char *)output);
    }
    this_00 = (protobuf *)&value;
    bVar1 = ConsumeNumber(this,(double *)this_00,"Expected number.");
    if (!bVar1) goto LAB_00351e4a;
    SimpleDtoa_abi_cxx11_((string *)&AStack_98,this_00,value);
    std::__cxx11::string::append((string *)output);
    break;
  case 3:
  case 0x10:
  case 0x12:
    uVar2 = 0x7fffffffffffffff;
    goto LAB_00351c10;
  case 4:
  case 6:
    uVar2 = 0xffffffffffffffff;
    goto LAB_00351d1a;
  case 5:
  case 0xf:
  case 0x11:
    uVar2 = 0x7fffffff;
LAB_00351c10:
    bVar1 = TryConsume(this,"-");
    if (bVar1) {
      std::__cxx11::string::append((char *)output);
      uVar2 = uVar2 + 1;
    }
    bVar1 = ConsumeInteger64(this,uVar2,&value_1,"Expected integer for field default value.");
    if (!bVar1) {
LAB_00351e4a:
      bVar1 = false;
      goto LAB_00351e4c;
    }
    strings::AlphaNum::AlphaNum(&AStack_98,value_1);
    StrCat_abi_cxx11_(&local_60,(protobuf *)&AStack_98,a);
    std::__cxx11::string::append((string *)output);
LAB_00351d9a:
    this_01 = (AlphaNum *)&local_60;
    break;
  case 7:
  case 0xd:
    uVar2 = 0xffffffff;
LAB_00351d1a:
    bVar1 = TryConsume(this,"-");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&AStack_98,"Unsigned field can\'t have negative default value.",
                 (allocator *)&local_60);
      AddError(this,(string *)&AStack_98);
      std::__cxx11::string::~string((string *)&AStack_98);
    }
    bVar1 = ConsumeInteger64(this,uVar2,&value_1,"Expected integer for field default value.");
    if (bVar1) {
      strings::AlphaNum::AlphaNum(&AStack_98,value_1);
      StrCat_abi_cxx11_(&local_60,(protobuf *)&AStack_98,a_00);
      std::__cxx11::string::append((string *)output);
      goto LAB_00351d9a;
    }
    goto LAB_00351e4a;
  case 8:
    bVar1 = TryConsume(this,"true");
    if ((!bVar1) && (bVar1 = TryConsume(this,"false"), !bVar1)) {
      std::__cxx11::string::string
                ((string *)&AStack_98,"Expected \"true\" or \"false\".",(allocator *)&local_60);
      AddError(this,(string *)&AStack_98);
      goto LAB_00351ca8;
    }
    std::__cxx11::string::assign((char *)output);
    goto switchD_00351bfc_default;
  case 9:
    bVar1 = ConsumeString(this,output,"Expected string for field default value.");
    goto LAB_00351e42;
  case 10:
  case 0xb:
    std::__cxx11::string::string
              ((string *)&AStack_98,"Messages can\'t have default values.",(allocator *)&local_60);
    AddError(this,(string *)&AStack_98);
LAB_00351ca8:
    std::__cxx11::string::~string((string *)&AStack_98);
    goto LAB_00351e4a;
  case 0xc:
    bVar1 = ConsumeString(this,output,"Expected string.");
    if (!bVar1) goto LAB_00351e4a;
    CEscape((string *)&AStack_98,output);
    std::__cxx11::string::operator=((string *)output,(string *)&AStack_98);
    this_01 = &AStack_98;
    break;
  case 0xe:
    bVar1 = ConsumeIdentifier(this,output,"Expected enum identifier for field default value.");
LAB_00351e42:
    if (bVar1 != false) goto switchD_00351bfc_default;
    goto LAB_00351e4a;
  default:
    goto switchD_00351bfc_default;
  }
  std::__cxx11::string::~string((string *)this_01);
switchD_00351bfc_default:
  bVar1 = true;
LAB_00351e4c:
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
}

Assistant:

bool Parser::ParseDefaultAssignment(
    FieldDescriptorProto* field, const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_default_value()) {
    AddError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  std::string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet. (If it were a primitive type, |field| would have a type set
    // already.) In this case, simply take the current string as the default
    // value; we will catch the error later if it is not a valid enum value.
    // (N.B. that we do not check whether the current token is an identifier:
    // doing so throws strange errors when the user mistypes a primitive
    // typename and we assume it's an enum. E.g.: "optional int foo = 1 [default
    // = 42]". In such a case the fundamental error is really that "int" is not
    // a type, not that "42" is not an identifier. See b/12533582.)
    *default_value = input_->current().text;
    input_->Next();
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64_t max_value = std::numeric_limits<int64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = std::numeric_limits<int32_t>::max();
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64_t max_value = std::numeric_limits<uint64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = std::numeric_limits<uint32_t>::max();
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        AddError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE:
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(SimpleDtoa(value));
      break;

    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        AddError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      // Note: When file option java_string_check_utf8 is true, if a
      // non-string representation (eg byte[]) is later supported, it must
      // be checked for UTF-8-ness.
      DO(ConsumeString(default_value,
                       "Expected string for field default "
                       "value."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value,
                           "Expected enum identifier for field "
                           "default value."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      AddError("Messages can't have default values.");
      return false;
  }

  return true;
}